

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O3

uint64_t bitShiftL(uint64_t inVar,int cnt)

{
  return inVar << ((byte)cnt & 0x3f);
}

Assistant:

uint64_t bitShiftL(uint64_t inVar, int cnt)
{

  // if (cnt > 32) { // tempULL = (1 << i);
  //   inVar = inVar << 30;
  //   inVar = inVar << 2;
  //   inVar = inVar << (cnt - 32);
  // } else if (cnt > 30) {
  //   inVar = inVar << 30;
  //   inVar = inVar << (cnt - 30);
  // } else {
  //   inVar = inVar << cnt;
  // }

  // return inVar;
  return inVar << cnt;
}